

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_str.c
# Opt level: O0

char * sr_stat_str(SRunner *sr)

{
  TestStats *t;
  uint uVar1;
  char *pcVar2;
  TestStats *ts;
  char *str;
  SRunner *sr_local;
  
  t = sr->stats;
  uVar1 = percent_passed(t);
  pcVar2 = ck_strdup_printf("%d%%: Checks: %d, Failures: %d, Errors: %d",(ulong)uVar1,
                            (ulong)(uint)t->n_checked,(ulong)(uint)t->n_failed,
                            (ulong)(uint)t->n_errors);
  return pcVar2;
}

Assistant:

char *sr_stat_str(SRunner * sr)
{
    char *str;
    TestStats *ts;

    ts = sr->stats;

    str = ck_strdup_printf("%d%%: Checks: %d, Failures: %d, Errors: %d",
                           percent_passed(ts), ts->n_checked, ts->n_failed,
                           ts->n_errors);

    return str;
}